

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::ReadBlockFromDisk(BlockManager *this,CBlock *block,CBlockIndex *index)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  bool bVar3;
  FlatFilePos FVar4;
  Logger *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  FlatFilePos block_pos;
  string local_110;
  string local_f0 [4];
  string local_70;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&log_msg,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
             ,0x431,false);
  FVar4 = CBlockIndex::GetBlockPos(index);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&log_msg);
  block_pos = FVar4;
  bVar2 = ReadBlockFromDisk(this,block,&block_pos);
  if (bVar2) {
    CBlockHeader::GetHash((uint256 *)&log_msg,&block->super_CBlockHeader);
    CBlockIndex::GetBlockHash((uint256 *)&local_70,index);
    bVar2 = ::operator!=((base_blob<256U> *)&log_msg,(base_blob<256U> *)&local_70);
    bVar3 = true;
    if (!bVar2) goto LAB_00764b90;
    CBlockIndex::ToString_abi_cxx11_(local_f0,index);
    FlatFilePos::ToString_abi_cxx11_(&local_110,&block_pos);
    pLVar5 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar5);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<char[18],std::__cxx11::string,std::__cxx11::string>
                (&local_70,(tinyformat *)"%s: GetHash() doesn\'t match index for %s at %s\n",
                 "ReadBlockFromDisk",(char (*) [18])local_f0,&local_110,args_2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      pLVar5 = LogInstance();
      local_70._M_dataplus._M_p = (pointer)0x5e;
      local_70._M_string_length = 0xcb2cf4;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x5e;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "ReadBlockFromDisk";
      logging_function._M_len = 0x11;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x437,ALL,Error);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)local_f0);
  }
  bVar3 = false;
LAB_00764b90:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadBlockFromDisk(CBlock& block, const CBlockIndex& index) const
{
    const FlatFilePos block_pos{WITH_LOCK(cs_main, return index.GetBlockPos())};

    if (!ReadBlockFromDisk(block, block_pos)) {
        return false;
    }
    if (block.GetHash() != index.GetBlockHash()) {
        LogError("%s: GetHash() doesn't match index for %s at %s\n", __func__, index.ToString(), block_pos.ToString());
        return false;
    }
    return true;
}